

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O1

uint64 mkvmuxer::WriteFrame(IMkvWriter *writer,Frame *frame,Cluster *cluster)

{
  bool bVar1;
  int32 iVar2;
  int iVar3;
  ulong value;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  undefined1 local_61;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  if (((frame != (Frame *)0x0 && writer != (IMkvWriter *)0x0) &&
      (bVar1 = Frame::IsValid(frame), cluster != (Cluster *)0x0 && bVar1)) &&
     (cluster->timecode_scale_ != 0)) {
    value = Cluster::GetRelativeTimecode(cluster,frame->timestamp_ / cluster->timecode_scale_);
    if (0x7fff < value) {
      return 0;
    }
    bVar1 = Frame::CanBeSimpleBlock(frame);
    if (bVar1) {
      iVar2 = WriteID(writer,0xa3);
      if (iVar2 == 0) {
        uVar9 = (ulong)((int)frame->length_ + 4);
        iVar2 = WriteUInt(writer,uVar9);
        if (((iVar2 == 0) && (iVar2 = WriteUInt(writer,frame->track_number_), iVar2 == 0)) &&
           ((iVar2 = SerializeInt(writer,value,2), iVar2 == 0 &&
            ((iVar2 = SerializeInt(writer,(ulong)frame->is_key_ << 7,1), iVar2 == 0 &&
             (iVar3 = (**writer->_vptr_IMkvWriter)(writer,frame->frame_,(ulong)(uint)frame->length_)
             , iVar3 == 0)))))) {
          lVar7 = 6;
          if ((0x7e < uVar9) &&
             ((((lVar7 = 7, 0x3ffe < uVar9 && (lVar7 = 8, 0x1ffffe < uVar9)) &&
               (lVar7 = 9, 0xffffffe < uVar9)) &&
              ((lVar7 = 10, 0x7fffffffe < uVar9 && (lVar7 = 0xb, 0x3fffffffffe < uVar9)))))) {
            lVar7 = 0xd - (ulong)(uVar9 < 0x1ffffffffffff);
          }
          return lVar7 + frame->length_;
        }
      }
    }
    else {
      uVar9 = cluster->timecode_scale_;
      if (frame->additional_ == (uint8_t *)0x0) {
        local_38 = 0;
        lVar7 = 0;
        local_40 = 0;
      }
      else {
        uVar10 = frame->additional_length_;
        lVar7 = 1;
        if ((((0x7e < uVar10) && (lVar7 = 2, 0x3ffe < uVar10)) &&
            ((lVar7 = 3, 0x1ffffe < uVar10 &&
             ((lVar7 = 4, 0xffffffe < uVar10 && (lVar7 = 5, 0x7fffffffe < uVar10)))))) &&
           (lVar7 = 6, 0x3fffffffffe < uVar10)) {
          lVar7 = 8 - (ulong)(uVar10 < 0x1ffffffffffff);
        }
        uVar8 = frame->add_id_;
        lVar5 = 3;
        if (((((0xff < uVar8) && (lVar5 = 4, 0xffff < uVar8)) && (lVar5 = 5, 0xffffff < uVar8)) &&
            ((lVar5 = 6, uVar8 >> 0x20 != 0 && (lVar5 = 7, uVar8 >> 0x28 != 0)))) &&
           (lVar5 = 8, uVar8 >> 0x30 != 0)) {
          lVar5 = 10 - (ulong)(uVar8 >> 0x38 == 0);
        }
        local_40 = uVar10 + 1 + lVar7 + lVar5;
        lVar7 = 2;
        if (((0x7e < local_40) && (lVar7 = 3, 0x3ffe < local_40)) &&
           ((lVar7 = 4, 0x1ffffe < local_40 &&
            (((lVar7 = 5, 0xffffffe < local_40 && (lVar7 = 6, 0x7fffffffe < local_40)) &&
             (lVar7 = 7, 0x3fffffffffe < local_40)))))) {
          lVar7 = 9 - (ulong)(local_40 < 0x1ffffffffffff);
        }
        local_38 = lVar7 + local_40;
        lVar7 = 3;
        if ((((0x7e < local_38) && (lVar7 = 4, 0x3ffe < local_38)) &&
            ((lVar7 = 5, 0x1ffffe < local_38 &&
             ((lVar7 = 6, 0xffffffe < local_38 && (lVar7 = 7, 0x7fffffffe < local_38)))))) &&
           (lVar7 = 8, 0x3fffffffffe < local_38)) {
          lVar7 = 10 - (ulong)(local_38 < 0x1ffffffffffff);
        }
        lVar7 = lVar7 + local_38;
      }
      if (frame->discard_padding_ == 0) {
        uVar10 = 0;
      }
      else {
        iVar2 = GetIntSize(frame->discard_padding_);
        uVar10 = (ulong)(iVar2 + 3);
      }
      lVar5 = 0;
      local_58 = (ulong)frame->reference_block_timestamp_ / uVar9;
      if (((((frame->is_key_ == false) && (lVar5 = 3, 0xff < local_58)) &&
           (lVar5 = 4, 0xffff < local_58)) &&
          ((lVar5 = 5, 0xffffff < local_58 && (lVar5 = 6, local_58 >> 0x20 != 0)))) &&
         ((lVar5 = 7, local_58 >> 0x28 != 0 && (lVar5 = 8, local_58 >> 0x30 != 0)))) {
        lVar5 = 10 - (ulong)(local_58 >> 0x38 == 0);
      }
      local_50 = frame->duration_;
      lVar6 = 0;
      local_60 = local_50 / uVar9;
      if (((uVar9 <= local_50) && (lVar6 = 3, 0xff < local_60)) &&
         ((lVar6 = 4, 0xffff < local_60 &&
          ((((lVar6 = 5, 0xffffff < local_60 && (lVar6 = 6, local_60 >> 0x20 != 0)) &&
            (lVar6 = 7, local_60 >> 0x28 != 0)) && (lVar6 = 8, local_60 >> 0x30 != 0)))))) {
        lVar6 = 10 - (ulong)(local_60 >> 0x38 == 0);
      }
      uVar8 = frame->length_ + 4;
      lVar4 = 2;
      if (((0x7e < uVar8) && (lVar4 = 3, 0x3ffe < uVar8)) &&
         (((lVar4 = 4, 0x1ffffe < uVar8 &&
           ((lVar4 = 5, 0xffffffe < uVar8 && (lVar4 = 6, 0x7fffffffe < uVar8)))) &&
          (lVar4 = 7, 0x3fffffffffe < uVar8)))) {
        lVar4 = 9 - (ulong)(uVar8 < 0x1ffffffffffff);
      }
      uVar10 = lVar5 + lVar6 + uVar10 + lVar7 + lVar4 + uVar8;
      local_48 = uVar9;
      bVar1 = WriteEbmlMasterElement(writer,0xa0,uVar10);
      if (((bVar1) && (bVar1 = WriteEbmlMasterElement(writer,0xa1,uVar8), bVar1)) &&
         (iVar2 = WriteUInt(writer,frame->track_number_), iVar2 == 0)) {
        iVar2 = SerializeInt(writer,value,2);
        if (writer == (IMkvWriter *)0x0) {
          return 0;
        }
        if (iVar2 != 0) {
          return 0;
        }
        local_61 = 0;
        iVar3 = (**writer->_vptr_IMkvWriter)(writer,&local_61,1);
        if ((-1 < iVar3) &&
           (iVar3 = (**writer->_vptr_IMkvWriter)(writer,frame->frame_,(ulong)(uint)frame->length_),
           iVar3 == 0)) {
          if (frame->additional_ != (uint8_t *)0x0) {
            bVar1 = WriteEbmlMasterElement(writer,0x75a1,local_38);
            if (!bVar1) {
              return 0;
            }
            bVar1 = WriteEbmlMasterElement(writer,0xa6,local_40);
            if (!bVar1) {
              return 0;
            }
            bVar1 = WriteEbmlElement(writer,0xee,frame->add_id_,0);
            if (!bVar1) {
              return 0;
            }
            bVar1 = WriteEbmlElement(writer,0xa5,frame->additional_,frame->additional_length_);
            if (!bVar1) {
              return 0;
            }
          }
          if ((frame->discard_padding_ == 0) ||
             (bVar1 = WriteEbmlElement(writer,0x75a2,frame->discard_padding_), bVar1)) {
            if ((frame->is_key_ == false) &&
               (bVar1 = WriteEbmlElement(writer,0xfb,local_58,0), !bVar1)) {
              return 0;
            }
            if ((local_48 <= local_50) && (bVar1 = WriteEbmlElement(writer,0x9b,local_60,0), !bVar1)
               ) {
              return 0;
            }
            lVar7 = 2;
            if ((((0x7e < uVar10) && (lVar7 = 3, 0x3ffe < uVar10)) && (lVar7 = 4, 0x1ffffe < uVar10)
                ) && (((lVar7 = 5, 0xffffffe < uVar10 && (lVar7 = 6, 0x7fffffffe < uVar10)) &&
                      (lVar7 = 7, 0x3fffffffffe < uVar10)))) {
              lVar7 = 9 - (ulong)(uVar10 < 0x1ffffffffffff);
            }
            return lVar7 + uVar10;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

uint64 WriteFrame(IMkvWriter* writer, const Frame* const frame,
                  Cluster* cluster) {
  if (!writer || !frame || !frame->IsValid() || !cluster ||
      !cluster->timecode_scale())
    return 0;

  //  Technically the timecode for a block can be less than the
  //  timecode for the cluster itself (remember that block timecode
  //  is a signed, 16-bit integer).  However, as a simplification we
  //  only permit non-negative cluster-relative timecodes for blocks.
  const int64 relative_timecode = cluster->GetRelativeTimecode(
      frame->timestamp() / cluster->timecode_scale());
  if (relative_timecode < 0 || relative_timecode > kMaxBlockTimecode)
    return 0;

  return frame->CanBeSimpleBlock()
             ? WriteSimpleBlock(writer, frame, relative_timecode)
             : WriteBlock(writer, frame, relative_timecode,
                          cluster->timecode_scale());
}